

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# commissioner_impl.cpp
# Opt level: O0

Error * ot::commissioner::internal::DecodeNetDiagData
                  (Error *__return_storage_ptr__,NetDiagData *aNetDiagData,ByteArray *aPayload)

{
  bool bVar1;
  bool bVar2;
  Error *pEVar3;
  mapped_type *pmVar4;
  element_type *peVar5;
  size_type sVar6;
  ByteArray *pBVar7;
  ErrorCode local_44c;
  Error local_448;
  reference local_420;
  Tlv *tlv;
  iterator __end3;
  iterator __begin3;
  TlvList *__range3;
  Error local_3f8;
  ByteArray *local_3d0;
  ByteArray *value_7;
  undefined1 local_3c0 [8];
  mapped_type eui64;
  Error local_3a8;
  ByteArray *local_380;
  ByteArray *value_6;
  undefined1 local_370 [8];
  mapped_type childTable;
  Error local_358;
  ByteArray *local_330;
  ByteArray *value_5;
  undefined1 local_320 [8];
  mapped_type macCounters;
  Error local_308;
  ByteArray *local_2e0;
  ByteArray *value_4;
  undefined1 local_2d0 [8];
  mapped_type ipv6Addrs;
  Error local_2b8;
  ByteArray *local_290;
  ByteArray *value_3;
  undefined1 local_280 [8];
  mapped_type leaderData;
  Error local_268;
  ByteArray *local_240;
  ByteArray *value_2;
  undefined1 local_230 [8];
  mapped_type route64;
  Error local_218;
  key_type local_1e9;
  undefined1 local_1e8 [8];
  mapped_type mode;
  undefined1 local_1d0 [4];
  uint16_t value_1;
  mapped_type macAddr;
  ByteArray *value;
  undefined1 local_1b0 [8];
  mapped_type extMacAddr;
  Error local_190;
  undefined1 local_168 [8];
  NetDiagData diagData;
  TlvList tlvList;
  TlvSet tlvSet;
  ByteArray *aPayload_local;
  NetDiagData *aNetDiagData_local;
  Error *error;
  
  bVar2 = false;
  Error::Error(__return_storage_ptr__);
  std::
  map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  ::map((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
         *)&tlvList.
            super__List_base<ot::commissioner::tlv::Tlv,_std::allocator<ot::commissioner::tlv::Tlv>_>
            ._M_impl._M_node._M_size);
  std::__cxx11::list<ot::commissioner::tlv::Tlv,_std::allocator<ot::commissioner::tlv::Tlv>_>::list
            ((list<ot::commissioner::tlv::Tlv,_std::allocator<ot::commissioner::tlv::Tlv>_> *)
             &diagData.mPresentFlags);
  NetDiagData::NetDiagData((NetDiagData *)local_168);
  commissioner::tlv::GetTlvSet
            (&local_190,
             (TlvSet *)
             &tlvList.
              super__List_base<ot::commissioner::tlv::Tlv,_std::allocator<ot::commissioner::tlv::Tlv>_>
              ._M_impl._M_node._M_size,aPayload,kNetworkDiag);
  pEVar3 = Error::operator=(__return_storage_ptr__,&local_190);
  extMacAddr.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._0_4_ = 0;
  bVar1 = commissioner::operator!=
                    (pEVar3,(ErrorCode *)
                            &extMacAddr.
                             super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                             ._M_refcount);
  Error::~Error(&local_190);
  if (!bVar1) {
    value._7_1_ = 0;
    pmVar4 = std::
             map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
             ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                           *)&tlvList.
                              super__List_base<ot::commissioner::tlv::Tlv,_std::allocator<ot::commissioner::tlv::Tlv>_>
                              ._M_impl._M_node._M_size,(key_type *)((long)&value + 7));
    std::shared_ptr<ot::commissioner::tlv::Tlv>::shared_ptr
              ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_1b0,pmVar4);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_1b0);
    if (bVar1) {
      peVar5 = std::
               __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_1b0);
      macAddr.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               commissioner::tlv::Tlv::GetValue(peVar5);
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 &diagData.mEui64.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_end_of_storage,
                 (vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 macAddr.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi);
      diagData.mChildIpv6AddrsInfoList.
      super__Vector_base<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((ulong)diagData.mChildIpv6AddrsInfoList.
                            super__Vector_base<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage | 1);
    }
    std::shared_ptr<ot::commissioner::tlv::Tlv>::~shared_ptr
              ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_1b0);
    mode.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
    _M_pi._7_1_ = 1;
    pmVar4 = std::
             map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
             ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                           *)&tlvList.
                              super__List_base<ot::commissioner::tlv::Tlv,_std::allocator<ot::commissioner::tlv::Tlv>_>
                              ._M_impl._M_node._M_size,
                          (key_type *)
                          ((long)&mode.
                                  super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                  ._M_refcount._M_pi + 7));
    std::shared_ptr<ot::commissioner::tlv::Tlv>::shared_ptr
              ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_1d0,pmVar4);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_1d0);
    if (bVar1) {
      peVar5 = std::
               __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_1d0);
      pBVar7 = commissioner::tlv::Tlv::GetValue(peVar5);
      mode.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi._4_2_ = utils::Decode<unsigned_short>(pBVar7);
      diagData.mChildIpv6AddrsInfoList.
      super__Vector_base<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage =
           (pointer)((ulong)diagData.mChildIpv6AddrsInfoList.
                            super__Vector_base<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage | 2);
      diagData.mExtMacAddr.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
      .super__Vector_impl_data._M_end_of_storage._0_2_ =
           mode.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi._4_2_;
    }
    std::shared_ptr<ot::commissioner::tlv::Tlv>::~shared_ptr
              ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_1d0);
    local_1e9 = kExtendedPanId;
    pmVar4 = std::
             map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
             ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                           *)&tlvList.
                              super__List_base<ot::commissioner::tlv::Tlv,_std::allocator<ot::commissioner::tlv::Tlv>_>
                              ._M_impl._M_node._M_size,&local_1e9);
    std::shared_ptr<ot::commissioner::tlv::Tlv>::shared_ptr
              ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_1e8,pmVar4);
    bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_1e8);
    if (bVar1) {
      peVar5 = std::
               __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)local_1e8);
      pBVar7 = commissioner::tlv::Tlv::GetValue(peVar5);
      DecodeModeData(&local_218,(ModeData *)local_168,pBVar7);
      pEVar3 = Error::operator=(__return_storage_ptr__,&local_218);
      route64.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi._4_4_ = 0;
      bVar1 = commissioner::operator!=
                        (pEVar3,(ErrorCode *)
                                ((long)&route64.
                                        super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                        ._M_refcount._M_pi + 4));
      Error::~Error(&local_218);
      if (!bVar1) {
        diagData.mChildIpv6AddrsInfoList.
        super__Vector_base<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage =
             (pointer)((ulong)diagData.mChildIpv6AddrsInfoList.
                              super__Vector_base<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage | 4);
        goto LAB_0026e5fe;
      }
      route64.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi._0_4_ = 4;
    }
    else {
LAB_0026e5fe:
      route64.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_refcount
      ._M_pi._0_4_ = 0;
    }
    std::shared_ptr<ot::commissioner::tlv::Tlv>::~shared_ptr
              ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_1e8);
    if ((int)route64.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi == 0) {
      value_2._7_1_ = 5;
      pmVar4 = std::
               map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
               ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                             *)&tlvList.
                                super__List_base<ot::commissioner::tlv::Tlv,_std::allocator<ot::commissioner::tlv::Tlv>_>
                                ._M_impl._M_node._M_size,(key_type *)((long)&value_2 + 7));
      std::shared_ptr<ot::commissioner::tlv::Tlv>::shared_ptr
                ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_230,pmVar4);
      bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_230);
      if (bVar1) {
        peVar5 = std::
                 __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)local_230);
        local_240 = commissioner::tlv::Tlv::GetValue(peVar5);
        DecodeRoute64(&local_268,(Route64 *)&diagData.mMacAddr,local_240);
        pEVar3 = Error::operator=(__return_storage_ptr__,&local_268);
        leaderData.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._4_4_ = 0;
        bVar1 = commissioner::operator!=
                          (pEVar3,(ErrorCode *)
                                  ((long)&leaderData.
                                          super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                          ._M_refcount._M_pi + 4));
        Error::~Error(&local_268);
        if (!bVar1) {
          diagData.mChildIpv6AddrsInfoList.
          super__Vector_base<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
          ._M_impl.super__Vector_impl_data._M_end_of_storage =
               (pointer)((ulong)diagData.mChildIpv6AddrsInfoList.
                                super__Vector_base<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
                                ._M_impl.super__Vector_impl_data._M_end_of_storage | 8);
          goto LAB_0026e77c;
        }
        route64.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._0_4_ = 4;
      }
      else {
LAB_0026e77c:
        route64.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
        _M_refcount._M_pi._0_4_ = 0;
      }
      std::shared_ptr<ot::commissioner::tlv::Tlv>::~shared_ptr
                ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_230);
      if ((int)route64.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi == 0) {
        value_3._7_1_ = 6;
        pmVar4 = std::
                 map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                 ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                               *)&tlvList.
                                  super__List_base<ot::commissioner::tlv::Tlv,_std::allocator<ot::commissioner::tlv::Tlv>_>
                                  ._M_impl._M_node._M_size,(key_type *)((long)&value_3 + 7));
        std::shared_ptr<ot::commissioner::tlv::Tlv>::shared_ptr
                  ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_280,pmVar4);
        bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_280);
        if (bVar1) {
          peVar5 = std::
                   __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)local_280);
          local_290 = commissioner::tlv::Tlv::GetValue(peVar5);
          DecodeLeaderData(&local_2b8,
                           (LeaderData *)
                           &diagData.mRoute64.mRouteData.
                            super__Vector_base<ot::commissioner::RouteDataEntry,_std::allocator<ot::commissioner::RouteDataEntry>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage,local_290);
          pEVar3 = Error::operator=(__return_storage_ptr__,&local_2b8);
          ipv6Addrs.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._4_4_ = 0;
          bVar1 = commissioner::operator!=
                            (pEVar3,(ErrorCode *)
                                    ((long)&ipv6Addrs.
                                            super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                            ._M_refcount._M_pi + 4));
          Error::~Error(&local_2b8);
          if (!bVar1) {
            diagData.mChildIpv6AddrsInfoList.
            super__Vector_base<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
            ._M_impl.super__Vector_impl_data._M_end_of_storage =
                 (pointer)((ulong)diagData.mChildIpv6AddrsInfoList.
                                  super__Vector_base<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage | 0x10);
            goto LAB_0026e8fa;
          }
          route64.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._0_4_ = 4;
        }
        else {
LAB_0026e8fa:
          route64.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
          _M_refcount._M_pi._0_4_ = 0;
        }
        std::shared_ptr<ot::commissioner::tlv::Tlv>::~shared_ptr
                  ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_280);
        if ((int)route64.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount._M_pi == 0) {
          value_4._7_1_ = 8;
          pmVar4 = std::
                   map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                   ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                                 *)&tlvList.
                                    super__List_base<ot::commissioner::tlv::Tlv,_std::allocator<ot::commissioner::tlv::Tlv>_>
                                    ._M_impl._M_node._M_size,(key_type *)((long)&value_4 + 7));
          std::shared_ptr<ot::commissioner::tlv::Tlv>::shared_ptr
                    ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_2d0,pmVar4);
          bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_2d0);
          if (bVar1) {
            peVar5 = std::
                     __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)local_2d0);
            local_2e0 = commissioner::tlv::Tlv::GetValue(peVar5);
            DecodeIpv6AddressList
                      (&local_308,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&diagData.mMacCounters.mIfOutDiscards,local_2e0);
            pEVar3 = Error::operator=(__return_storage_ptr__,&local_308);
            macCounters.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._4_4_ = 0;
            bVar1 = commissioner::operator!=
                              (pEVar3,(ErrorCode *)
                                      ((long)&macCounters.
                                              super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                              ._M_refcount._M_pi + 4));
            Error::~Error(&local_308);
            if (!bVar1) {
              diagData.mChildIpv6AddrsInfoList.
              super__Vector_base<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage =
                   (pointer)((ulong)diagData.mChildIpv6AddrsInfoList.
                                    super__Vector_base<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
                                    ._M_impl.super__Vector_impl_data._M_end_of_storage | 0x20);
              goto LAB_0026ea78;
            }
            route64.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._0_4_ = 4;
          }
          else {
LAB_0026ea78:
            route64.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi._0_4_ = 0;
          }
          std::shared_ptr<ot::commissioner::tlv::Tlv>::~shared_ptr
                    ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_2d0);
          if ((int)route64.
                   super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                   _M_refcount._M_pi == 0) {
            value_5._7_1_ = 9;
            pmVar4 = std::
                     map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                     ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                                   *)&tlvList.
                                      super__List_base<ot::commissioner::tlv::Tlv,_std::allocator<ot::commissioner::tlv::Tlv>_>
                                      ._M_impl._M_node._M_size,(key_type *)((long)&value_5 + 7));
            std::shared_ptr<ot::commissioner::tlv::Tlv>::shared_ptr
                      ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_320,pmVar4);
            bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_320);
            if (bVar1) {
              peVar5 = std::
                       __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                     *)local_320);
              local_330 = commissioner::tlv::Tlv::GetValue(peVar5);
              DecodeMacCounters(&local_358,(MacCounters *)&diagData.mLeaderData,local_330);
              pEVar3 = Error::operator=(__return_storage_ptr__,&local_358);
              childTable.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi._4_4_ = 0;
              bVar1 = commissioner::operator!=
                                (pEVar3,(ErrorCode *)
                                        ((long)&childTable.
                                                super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                                ._M_refcount._M_pi + 4));
              Error::~Error(&local_358);
              if (!bVar1) {
                diagData.mChildIpv6AddrsInfoList.
                super__Vector_base<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
                ._M_impl.super__Vector_impl_data._M_end_of_storage =
                     (pointer)((ulong)diagData.mChildIpv6AddrsInfoList.
                                      super__Vector_base<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage | 0x100);
                goto LAB_0026ebf8;
              }
              route64.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi._0_4_ = 4;
            }
            else {
LAB_0026ebf8:
              route64.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi._0_4_ = 0;
            }
            std::shared_ptr<ot::commissioner::tlv::Tlv>::~shared_ptr
                      ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_320);
            if ((int)route64.
                     super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                     _M_refcount._M_pi == 0) {
              value_6._7_1_ = 0x10;
              pmVar4 = std::
                       map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                       ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                                     *)&tlvList.
                                        super__List_base<ot::commissioner::tlv::Tlv,_std::allocator<ot::commissioner::tlv::Tlv>_>
                                        ._M_impl._M_node._M_size,(key_type *)((long)&value_6 + 7));
              std::shared_ptr<ot::commissioner::tlv::Tlv>::shared_ptr
                        ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_370,pmVar4);
              bVar1 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_370);
              if (bVar1) {
                peVar5 = std::
                         __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                       *)local_370);
                local_380 = commissioner::tlv::Tlv::GetValue(peVar5);
                DecodeChildTable(&local_3a8,
                                 (vector<ot::commissioner::ChildTableEntry,_std::allocator<ot::commissioner::ChildTableEntry>_>
                                  *)&diagData.mAddrs.
                                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,local_380);
                pEVar3 = Error::operator=(__return_storage_ptr__,&local_3a8);
                eui64.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi._4_4_ = 0;
                bVar1 = commissioner::operator!=
                                  (pEVar3,(ErrorCode *)
                                          ((long)&eui64.
                                                  super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>
                                                  ._M_refcount._M_pi + 4));
                Error::~Error(&local_3a8);
                if (!bVar1) {
                  diagData.mChildIpv6AddrsInfoList.
                  super__Vector_base<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pointer)((ulong)diagData.mChildIpv6AddrsInfoList.
                                        super__Vector_base<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage | 0x40);
                  goto LAB_0026ed76;
                }
                route64.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi._0_4_ = 4;
              }
              else {
LAB_0026ed76:
                route64.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount._M_pi._0_4_ = 0;
              }
              std::shared_ptr<ot::commissioner::tlv::Tlv>::~shared_ptr
                        ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_370);
              if ((int)route64.
                       super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi == 0) {
                value_7._7_1_ = 0x17;
                pmVar4 = std::
                         map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                         ::operator[]((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
                                       *)&tlvList.
                                          super__List_base<ot::commissioner::tlv::Tlv,_std::allocator<ot::commissioner::tlv::Tlv>_>
                                          ._M_impl._M_node._M_size,(key_type *)((long)&value_7 + 7))
                ;
                std::shared_ptr<ot::commissioner::tlv::Tlv>::shared_ptr
                          ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_3c0,pmVar4);
                bVar2 = std::__shared_ptr::operator_cast_to_bool((__shared_ptr *)local_3c0);
                if (bVar2) {
                  peVar5 = std::
                           __shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           ::operator->((__shared_ptr_access<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                         *)local_3c0);
                  local_3d0 = commissioner::tlv::Tlv::GetValue(peVar5);
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&diagData,
                             local_3d0);
                  diagData.mChildIpv6AddrsInfoList.
                  super__Vector_base<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage =
                       (pointer)((ulong)diagData.mChildIpv6AddrsInfoList.
                                        super__Vector_base<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
                                        ._M_impl.super__Vector_impl_data._M_end_of_storage | 0x80);
                }
                std::shared_ptr<ot::commissioner::tlv::Tlv>::~shared_ptr
                          ((shared_ptr<ot::commissioner::tlv::Tlv> *)local_3c0);
                commissioner::tlv::GetTlvListByType
                          (&local_3f8,(TlvList *)&diagData.mPresentFlags,aPayload,
                           kNetworkDiagChildIpv6Address,kNetworkDiag);
                pEVar3 = Error::operator=(__return_storage_ptr__,&local_3f8);
                __range3._4_4_ = 0;
                bVar2 = commissioner::operator!=(pEVar3,(ErrorCode *)((long)&__range3 + 4));
                Error::~Error(&local_3f8);
                if (!bVar2) {
                  sVar6 = std::__cxx11::
                          list<ot::commissioner::tlv::Tlv,_std::allocator<ot::commissioner::tlv::Tlv>_>
                          ::size((list<ot::commissioner::tlv::Tlv,_std::allocator<ot::commissioner::tlv::Tlv>_>
                                  *)&diagData.mPresentFlags);
                  if (sVar6 != 0) {
                    __end3 = std::__cxx11::
                             list<ot::commissioner::tlv::Tlv,_std::allocator<ot::commissioner::tlv::Tlv>_>
                             ::begin((list<ot::commissioner::tlv::Tlv,_std::allocator<ot::commissioner::tlv::Tlv>_>
                                      *)&diagData.mPresentFlags);
                    tlv = (Tlv *)std::__cxx11::
                                 list<ot::commissioner::tlv::Tlv,_std::allocator<ot::commissioner::tlv::Tlv>_>
                                 ::end((list<ot::commissioner::tlv::Tlv,_std::allocator<ot::commissioner::tlv::Tlv>_>
                                        *)&diagData.mPresentFlags);
                    while (bVar2 = std::operator!=(&__end3,(_Self *)&tlv), bVar2) {
                      local_420 = std::_List_iterator<ot::commissioner::tlv::Tlv>::operator*
                                            (&__end3);
                      pBVar7 = commissioner::tlv::Tlv::GetValue(local_420);
                      DecodeChildIpv6AddressList
                                (&local_448,
                                 (vector<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
                                  *)&diagData.mChildTable.
                                     super__Vector_base<ot::commissioner::ChildTableEntry,_std::allocator<ot::commissioner::ChildTableEntry>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage,pBVar7);
                      pEVar3 = Error::operator=(__return_storage_ptr__,&local_448);
                      local_44c = kNone;
                      bVar2 = commissioner::operator!=(pEVar3,&local_44c);
                      Error::~Error(&local_448);
                      if (bVar2) goto LAB_0026f07c;
                      std::_List_iterator<ot::commissioner::tlv::Tlv>::operator++(&__end3);
                    }
                    diagData.mChildIpv6AddrsInfoList.
                    super__Vector_base<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage =
                         (pointer)((ulong)diagData.mChildIpv6AddrsInfoList.
                                          super__Vector_base<ot::commissioner::ChildIpv6AddrInfo,_std::allocator<ot::commissioner::ChildIpv6AddrInfo>_>
                                          ._M_impl.super__Vector_impl_data._M_end_of_storage | 0x200
                                  );
                  }
                  NetDiagData::operator=(aNetDiagData,(NetDiagData *)local_168);
                }
                goto LAB_0026f07c;
              }
            }
          }
        }
      }
    }
    if ((int)route64.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount._M_pi != 4) goto LAB_0026f08a;
  }
LAB_0026f07c:
  bVar2 = true;
  route64.super___shared_ptr<ot::commissioner::tlv::Tlv,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi._0_4_ = 1;
LAB_0026f08a:
  NetDiagData::~NetDiagData((NetDiagData *)local_168);
  std::__cxx11::list<ot::commissioner::tlv::Tlv,_std::allocator<ot::commissioner::tlv::Tlv>_>::~list
            ((list<ot::commissioner::tlv::Tlv,_std::allocator<ot::commissioner::tlv::Tlv>_> *)
             &diagData.mPresentFlags);
  std::
  map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
  ::~map((map<ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>,_std::less<ot::commissioner::tlv::Type>,_std::allocator<std::pair<const_ot::commissioner::tlv::Type,_std::shared_ptr<ot::commissioner::tlv::Tlv>_>_>_>
          *)&tlvList.
             super__List_base<ot::commissioner::tlv::Tlv,_std::allocator<ot::commissioner::tlv::Tlv>_>
             ._M_impl._M_node._M_size);
  if (!bVar2) {
    Error::~Error(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

Error internal::DecodeNetDiagData(NetDiagData &aNetDiagData, const ByteArray &aPayload)
{
    Error        error;
    tlv::TlvSet  tlvSet;
    tlv::TlvList tlvList;
    NetDiagData  diagData;

    SuccessOrExit(error = tlv::GetTlvSet(tlvSet, aPayload, tlv::Scope::kNetworkDiag));

    if (auto extMacAddr = tlvSet[tlv::Type::kNetworkDiagExtMacAddress])
    {
        const ByteArray &value = extMacAddr->GetValue();
        diagData.mExtMacAddr   = value;
        diagData.mPresentFlags |= NetDiagData::kExtMacAddrBit;
    }

    if (auto macAddr = tlvSet[tlv::Type::kNetworkDiagMacAddress])
    {
        uint16_t value;
        value             = utils::Decode<uint16_t>(macAddr->GetValue());
        diagData.mMacAddr = value;
        diagData.mPresentFlags |= NetDiagData::kMacAddrBit;
    }

    if (auto mode = tlvSet[tlv::Type::kNetworkDiagMode])
    {
        SuccessOrExit(error = internal::DecodeModeData(diagData.mMode, mode->GetValue()));
        diagData.mPresentFlags |= NetDiagData::kModeBit;
    }

    if (auto route64 = tlvSet[tlv::Type::kNetworkDiagRoute64])
    {
        const ByteArray &value = route64->GetValue();
        SuccessOrExit(error = DecodeRoute64(diagData.mRoute64, value));
        diagData.mPresentFlags |= NetDiagData::kRoute64Bit;
    }

    if (auto leaderData = tlvSet[tlv::Type::kNetworkDiagLeaderData])
    {
        const ByteArray &value = leaderData->GetValue();
        SuccessOrExit(error = DecodeLeaderData(diagData.mLeaderData, value));
        diagData.mPresentFlags |= NetDiagData::kLeaderDataBit;
    }

    if (auto ipv6Addrs = tlvSet[tlv::Type::kNetworkDiagIpv6Address])
    {
        const ByteArray &value = ipv6Addrs->GetValue();
        SuccessOrExit(error = DecodeIpv6AddressList(diagData.mAddrs, value));
        diagData.mPresentFlags |= NetDiagData::kAddrsBit;
    }

    if (auto macCounters = tlvSet[tlv::Type::kNetworkDiagMacCounters])
    {
        const ByteArray &value = macCounters->GetValue();
        SuccessOrExit(error = DecodeMacCounters(diagData.mMacCounters, value));
        diagData.mPresentFlags |= NetDiagData::kMacCountersBit;
    }

    if (auto childTable = tlvSet[tlv::Type::kNetworkDiagChildTable])
    {
        const ByteArray &value = childTable->GetValue();
        SuccessOrExit(error = DecodeChildTable(diagData.mChildTable, value));
        diagData.mPresentFlags |= NetDiagData::kChildTableBit;
    }

    if (auto eui64 = tlvSet[tlv::Type::kNetworkDiagEui64])
    {
        const ByteArray &value = eui64->GetValue();
        diagData.mEui64        = value;
        diagData.mPresentFlags |= NetDiagData::kEui64Bit;
    }

    SuccessOrExit(error = tlv::GetTlvListByType(tlvList, aPayload, tlv::Type::kNetworkDiagChildIpv6Address,
                                                tlv::Scope::kNetworkDiag));

    if (tlvList.size() > 0)
    {
        for (const auto &tlv : tlvList)
        {
            SuccessOrExit(error = DecodeChildIpv6AddressList(diagData.mChildIpv6AddrsInfoList, tlv.GetValue()));
        }
        diagData.mPresentFlags |= NetDiagData::kChildIpv6AddrsInfoListBit;
    }

    aNetDiagData = diagData;

exit:
    return error;
}